

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

void __thiscall Hpipe::Instruction::update_in_a_branch(Instruction *this)

{
  Instruction *pIVar1;
  pointer pTVar2;
  pointer pTVar3;
  Instruction *inst;
  Vec<Hpipe::Instruction_*> *__range1;
  Vec<Hpipe::Instruction_*> tails;
  _Vector_base<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_> local_48;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &local_48;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/Instruction.cpp:466:12)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(Hpipe::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/hleclerc[P]Hpipe/src/Hpipe/Instruction.cpp:466:12)>
             ::_M_manager;
  apply(this,(function<void_(Hpipe::Instruction_*)> *)&local_28,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  for (pTVar2 = (pointer)local_48._M_impl.super__Vector_impl_data._M_start; pTVar3 = pTVar2,
      pTVar2 != (pointer)local_48._M_impl.super__Vector_impl_data._M_finish;
      pTVar2 = (pointer)&pTVar2->rcitem) {
    do {
      pIVar1 = pTVar3->inst;
      if (pIVar1->in_a_branch == false) break;
      pIVar1->in_a_branch = false;
      pTVar3 = (pIVar1->prev).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
               super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while ((long)(pIVar1->prev).
                   super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                   super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)pTVar3 == 0x28);
  }
  while (this->in_a_branch != false) {
    this->in_a_branch = false;
    pTVar2 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
              super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pTVar2 != 0x28) break;
    this = pTVar2->inst;
  }
  std::_Vector_base<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void Instruction::update_in_a_branch() {
    Vec<Instruction *> tails;
    apply( [&]( Instruction *inst ) {
        inst->in_a_branch = true;
        if ( inst->next.empty() )
            tails << inst;
    } );

    // tails
    for( Instruction *inst : tails ) {
        while( true ) {
            if ( inst->in_a_branch == false )
                break;
            inst->in_a_branch = false;
            if ( inst->prev.size() != 1 )
                break;
            inst = inst->prev[ 0 ].inst;
        }
    }

    // head
    for( Instruction *inst = this; ; ) {
        if ( inst->in_a_branch == false )
            break;
        inst->in_a_branch = false;
        if ( inst->next.size() != 1 )
            break;
        inst = inst->next[ 0 ].inst;
    }
}